

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaTeX.cpp
# Opt level: O3

string * __thiscall
Shell::LaTeX::toString_abi_cxx11_
          (string *__return_storage_ptr__,LaTeX *this,TermList *terms,bool single)

{
  char *pcVar1;
  bool bVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type sVar7;
  uint uVar8;
  uint64_t uVar9;
  _Alloc_hider this_00;
  LaTeX *this_01;
  undefined8 uVar10;
  byte bVar11;
  ulong uVar12;
  string *psVar13;
  undefined1 auVar14 [16];
  string from;
  string result;
  string to;
  string template_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  uint local_6c;
  string *local_68;
  LaTeX *local_60;
  string local_58;
  TermList *local_38;
  
  local_60 = this;
  if ((terms->_content & 3) == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  uVar12 = CONCAT71(in_register_00000009,single) & 0xffffffff;
  this_00._M_p = " (";
  bVar11 = (byte)uVar12;
  if (bVar11 != 0) {
    this_00._M_p = "";
  }
  local_d0 = local_c0;
  local_68 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,this_00._M_p,this_00._M_p + (ulong)(bVar11 ^ 1) * 2);
  uVar9 = terms->_content;
  if (((uint)uVar9 & 3) == 2) {
    if (bVar11 != 0) {
LAB_006eb13d:
      psVar13 = local_68;
      (local_68->_M_dataplus)._M_p = (pointer)&local_68->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,local_d0,local_c8 + (long)local_d0);
      goto LAB_006eb552;
    }
  }
  else {
    bVar2 = true;
    local_6c = (uint)CONCAT71(in_register_00000009,single);
    do {
      if (!bVar2) {
        this_00._M_p = ",";
        std::__cxx11::string::append((char *)&local_d0);
        uVar9 = terms->_content;
      }
      if ((uVar9 & 1) == 0) {
        this_01 = (LaTeX *)Kernel::theory;
        Kernel::Theory::tryGetInterpretedLaTeXName_abi_cxx11_
                  (&local_90,(Theory *)Kernel::theory,*(uint *)(uVar9 + 8),false,true);
        if (local_90._M_string_length == 0) {
          symbolToString_abi_cxx11_(&local_b0,this_01,*(uint *)(uVar9 + 8),false);
          toString_abi_cxx11_(&local_58,local_60,
                              (TermList *)
                              ((ulong)(*(uint *)(uVar9 + 0xc) & 0xfffffff) * 8 + 0x28 + uVar9),false
                             );
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            uVar10 = local_b0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_58._M_string_length + local_b0._M_string_length) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              uVar10 = local_58.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_58._M_string_length + local_b0._M_string_length)
            goto LAB_006eb450;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_58,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
          }
          else {
LAB_006eb450:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)local_58._M_dataplus._M_p);
          }
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 == paVar6) {
            local_e0._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_e0._8_8_ = puVar5[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar5;
          }
          *puVar5 = paVar6;
          puVar5[1] = 0;
          paVar6->_M_local_buf[0] = '\0';
          this_00._M_p = (pointer)local_f0;
          std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
          if (local_f0 != &local_e0) {
            this_00._M_p = (pointer)(local_e0._M_allocated_capacity + 1);
            operator_delete(local_f0,(ulong)this_00._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            this_00._M_p = (pointer)(local_58.field_2._M_allocated_capacity + 1);
            operator_delete(local_58._M_dataplus._M_p,(ulong)this_00._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            this_00._M_p = (pointer)(local_b0.field_2._M_allocated_capacity + 1);
            operator_delete(local_b0._M_dataplus._M_p,(ulong)this_00._M_p);
          }
        }
        else {
          if ((*(uint *)(uVar9 + 0xc) & 0xfffffff) != 0) {
            uVar8 = 0;
            sVar7 = local_90._M_string_length;
            local_38 = terms;
            do {
              Lib::Int::toString_abi_cxx11_(&local_b0,(Int *)(ulong)uVar8,(uint)sVar7);
              plVar3 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_b0,0,(char *)0x0,0x90e3e5);
              local_f0 = &local_e0;
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar3 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar3 == paVar6) {
                local_e0._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_e0._8_8_ = plVar3[3];
              }
              else {
                local_e0._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*plVar3;
              }
              pcVar1 = (char *)plVar3[1];
              *plVar3 = (long)paVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              toString_abi_cxx11_(&local_b0,local_60,
                                  (TermList *)
                                  (uVar9 + 0x28 +
                                  ((ulong)(*(uint *)(uVar9 + 0xc) & 0xfffffff) - (long)(int)uVar8) *
                                  8),true);
              auVar14 = std::__cxx11::string::find((char *)&local_90,(ulong)local_f0,0);
              lVar4 = auVar14._0_8_;
              while( true ) {
                sVar7 = auVar14._8_8_;
                if (lVar4 == -1) break;
                std::__cxx11::string::replace
                          ((ulong)&local_90,auVar14._0_8_,pcVar1,(ulong)local_b0._M_dataplus._M_p);
                auVar14 = std::__cxx11::string::find
                                    ((char *)&local_90,(ulong)local_f0,
                                     auVar14._0_8_ + local_b0._M_string_length);
                lVar4 = auVar14._0_8_;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
                sVar7 = extraout_RDX;
              }
              if (local_f0 != &local_e0) {
                operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
                sVar7 = extraout_RDX_00;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < (*(uint *)(uVar9 + 0xc) & 0xfffffff));
            uVar12 = (ulong)local_6c;
            terms = local_38;
          }
          this_00._M_p = local_90._M_dataplus._M_p;
          std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90._M_dataplus._M_p);
        }
      }
      else {
        varToString_abi_cxx11_(&local_90,(LaTeX *)this_00._M_p,(uint)(uVar9 >> 2));
        this_00._M_p = local_90._M_dataplus._M_p;
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        this_00._M_p = (pointer)(local_90.field_2._M_allocated_capacity + 1);
        operator_delete(local_90._M_dataplus._M_p,(ulong)this_00._M_p);
      }
      if ((char)uVar12 != '\0') goto LAB_006eb13d;
      uVar9 = terms[-1]._content;
      terms = terms + -1;
      bVar2 = false;
    } while (((uint)uVar9 & 3) != 2);
  }
  psVar13 = local_68;
  (local_68->_M_dataplus)._M_p = (pointer)&local_68->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,local_d0,local_c8 + (long)local_d0);
  std::__cxx11::string::append((char *)psVar13);
LAB_006eb552:
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  return psVar13;
}

Assistant:

std::string LaTeX::toString (TermList* terms,bool single) const
{
  if (terms->isEmpty()) {
    return "";
  }

  std::string result = single ? "" : " (";
  bool first=true;
  TermList* t=terms;
  while(t->isNonEmpty()) {

    if(first){
      first=false;
    }
    else{
        result += ",";
    }

//   if (_map) {
//     std::string result;
//     if (_map->toString(t,*this,result)) {
//       return result;
//     }
//   }
    if(t->isVar()) {
      ASS(t->isOrdinaryVar());
      result += varToString(t->var()); 
    }
    else {
      ASS(t->isTerm());
      Term* trm=t->term();

     //Check if this symbol has an interpreted LaTeX name
     // this should be true for all known interpreted symbols and any recorded symbols
      std::string template_str = theory->tryGetInterpretedLaTeXName(trm->functor(),false);
   
      if(template_str.empty()){
        result += symbolToString(trm->functor(), false) + toString(trm->args());
      }
      else{
        // replace arguments in the template, arg0 replaces a0 etc.
        for(unsigned i=0;i<trm->arity();i++){
          std::string from = "a"+Lib::Int::toString(i);
          std::string to = toString(trm->nthArgument(i),true);
          size_t start_pos = 0;
          while((start_pos = template_str.find(from, start_pos)) != std::string::npos) {
            template_str.replace(start_pos, from.length(), to);
            start_pos += to.length();
          }
        }
        result += template_str;
      }
    }

    if(single) break;
    t=t->next();
  }
  return single? result : result + ")";
}